

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

Data * __thiscall
QTzTimeZonePrivate::dataFromRule
          (QTzTimeZonePrivate *this,QTzTransitionRule rule,qint64 msecsSinceEpoch)

{
  undefined1 in_CL;
  Data *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Data *name;
  Data *this_00;
  Data local_40;
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.offsetFromUtc = CONCAT31(local_40.offsetFromUtc._1_3_,in_CL);
  local_10 = local_40.offsetFromUtc;
  name = in_RDI;
  QList<QByteArray>::at
            ((QList<QByteArray> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  this_00 = &local_40;
  QString::fromUtf8<void>((QByteArray *)in_RDI);
  QTimeZonePrivate::Data::Data
            (this_00,&name->abbreviation,(qint64)in_RDI,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78);
  QString::~QString((QString *)0x74d67a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::dataFromRule(QTzTransitionRule rule,
                                                        qint64 msecsSinceEpoch) const
{
    return Data(QString::fromUtf8(cached_data.m_abbreviations.at(rule.abbreviationIndex)),
                msecsSinceEpoch, rule.stdOffset + rule.dstOffset, rule.stdOffset);
}